

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O1

double despot::State::Weight(vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  pointer ppSVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 3;
    dVar4 = 0.0;
    lVar3 = 0;
    do {
      dVar4 = dVar4 + ppSVar1[lVar3]->weight;
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
    return dVar4;
  }
  return 0.0;
}

Assistant:

double State::Weight(const vector<State*>& particles) {
	double weight = 0;
	for (int i = 0; i < particles.size(); i++)
		weight += particles[i]->weight;
	return weight;
}